

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O3

void Gia_ManFraStop(Gia_ManFra_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  
  pVVar1 = p->vIns;
  iVar3 = pVVar1->nSize;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar4];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
        iVar3 = pVVar1->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  pVVar1 = p->vAnds;
  iVar3 = pVVar1->nSize;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar4];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
        iVar3 = pVVar1->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  pVVar1 = p->vOuts;
  iVar3 = pVVar1->nSize;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar4];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
        iVar3 = pVVar1->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  if (p != (Gia_ManFra_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_ManFraStop( Gia_ManFra_t * p )  
{
    Vec_VecFree( (Vec_Vec_t *)p->vIns );
    Vec_VecFree( (Vec_Vec_t *)p->vAnds );
    Vec_VecFree( (Vec_Vec_t *)p->vOuts );
    ABC_FREE( p );
}